

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<std::complex<double>,_1000> * __thiscall
TPZManVector<std::complex<double>,_1000>::operator=
          (TPZManVector<std::complex<double>,_1000> *this,
          TPZManVector<std::complex<double>,_1000> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  complex<double> *pcVar4;
  long lVar5;
  ulong uVar6;
  
  if (this != copy) {
    uVar6 = (copy->super_TPZVec<std::complex<double>_>).fNElements;
    if (((this->super_TPZVec<std::complex<double>_>).fNAlloc < (long)uVar6) &&
       (pcVar4 = (this->super_TPZVec<std::complex<double>_>).fStore,
       pcVar4 != this->fExtAlloc && pcVar4 != (complex<double> *)0x0)) {
      operator_delete__(pcVar4);
      (this->super_TPZVec<std::complex<double>_>).fStore = (complex<double> *)0x0;
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = 0;
    }
    if ((long)uVar6 < 0x3e9) {
      pcVar4 = (this->super_TPZVec<std::complex<double>_>).fStore;
      if (pcVar4 != (complex<double> *)0x0 && pcVar4 != this->fExtAlloc) {
        operator_delete__(pcVar4);
      }
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = 0;
      (this->super_TPZVec<std::complex<double>_>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<std::complex<double>_>).fNAlloc < (long)uVar6) {
      pcVar4 = (complex<double> *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | uVar6 << 4);
      memset(pcVar4,0,uVar6 << 4);
      (this->super_TPZVec<std::complex<double>_>).fStore = pcVar4;
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = uVar6;
    }
    (this->super_TPZVec<std::complex<double>_>).fNElements = uVar6;
    if (0 < (long)uVar6) {
      lVar5 = 0;
      do {
        puVar1 = (undefined8 *)
                 (((copy->super_TPZVec<std::complex<double>_>).fStore)->_M_value + lVar5);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)
                 (((this->super_TPZVec<std::complex<double>_>).fStore)->_M_value + lVar5);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        lVar5 = lVar5 + 0x10;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}